

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

void __thiscall xemmai::t_list::f_resize(t_list *this)

{
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  size_t sVar1;
  size_t sVar2;
  t_object *ptVar3;
  t_list *a_size;
  __pointer_type ptVar4;
  long *in_FS_OFFSET;
  anon_class_16_2_e0e9b28f a_construct;
  size_t local_88;
  t_tuple *tuple0;
  size_t size;
  t_list *this_local;
  __pointer_type p;
  
  sVar1 = t_object::f_capacity_to_size<xemmai::t_tuple,xemmai::t_slot>(this->v_size);
  sVar2 = t_object::f_size_to_capacity<xemmai::t_tuple,xemmai::t_slot>(sVar1 << 1);
  this->v_grow = sVar2;
  if (sVar1 < 0x100) {
    local_88 = 0;
  }
  else {
    local_88 = t_object::f_size_to_capacity<xemmai::t_tuple,xemmai::t_slot>(sVar1 >> 1);
  }
  this->v_shrink = local_88;
  ptVar3 = t_slot::operator->(&this->v_tuple);
  a_size = (t_list *)t_object::f_as<xemmai::t_tuple>(ptVar3);
  a_construct.this = a_size;
  a_construct.tuple0 = (t_tuple *)this;
  ptVar3 = t_tuple::f_instantiate<xemmai::t_list::f_resize()::__0>
                     ((t_tuple *)this->v_grow,(size_t)a_size,a_construct);
  if ((t_object *)0x4 < ptVar3) {
    this_00 = *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68);
    *this_00->v_head = ptVar3;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  ptVar4 = std::atomic<xemmai::t_object_*>::exchange(&(this->v_tuple).v_p,ptVar3,relaxed);
  if ((__pointer_type)0x4 < ptVar4) {
    this_01 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
    *this_01->v_head = ptVar4;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  this->v_head = 0;
  return;
}

Assistant:

void t_list::f_resize()
{
	auto size = t_object::f_capacity_to_size<t_tuple, t_slot>(v_size);
	v_grow = t_object::f_size_to_capacity<t_tuple, t_slot>(size * 2);
	v_shrink = size < sizeof(t_object) * 2 ? 0 : t_object::f_size_to_capacity<t_tuple, t_slot>(size / 2);
	auto& tuple0 = v_tuple->f_as<t_tuple>();
	v_tuple = t_tuple::f_instantiate(v_grow, [&](auto& tuple1)
	{
		size_t n = tuple0.f_size();
		size_t i = 0;
		if (v_head + v_size > n) {
			do new(&tuple1[i++]) t_svalue(tuple0[v_head++]); while (v_head < n);
			v_head = 0;
		}
		do new(&tuple1[i++]) t_svalue(tuple0[v_head++]); while (i < v_size);
		do new(&tuple1[i++]) t_svalue; while (i < v_grow);
	});
	v_head = 0;
}